

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O3

void __thiscall FIX::FileLog::FileLog(FileLog *this,string *path,string *backupPath,SessionID *s)

{
  pointer pcVar1;
  FileLog *this_00;
  long *local_a0 [2];
  long local_90 [2];
  ofstream *local_80;
  ofstream *local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_001ead58;
  local_78 = &this->m_messages;
  std::ofstream::ofstream(local_78);
  local_80 = &this->m_event;
  std::ofstream::ofstream(local_80);
  (this->m_messagesFileName)._M_dataplus._M_p = (pointer)&(this->m_messagesFileName).field_2;
  (this->m_messagesFileName)._M_string_length = 0;
  (this->m_messagesFileName).field_2._M_local_buf[0] = '\0';
  (this->m_eventFileName)._M_dataplus._M_p = (pointer)&(this->m_eventFileName).field_2;
  (this->m_eventFileName)._M_string_length = 0;
  (this->m_eventFileName).field_2._M_local_buf[0] = '\0';
  (this->m_fullPrefix)._M_dataplus._M_p = (pointer)&(this->m_fullPrefix).field_2;
  (this->m_fullPrefix)._M_string_length = 0;
  (this->m_fullPrefix).field_2._M_local_buf[0] = '\0';
  (this->m_fullBackupPrefix)._M_dataplus._M_p = (pointer)&(this->m_fullBackupPrefix).field_2;
  (this->m_fullBackupPrefix)._M_string_length = 0;
  (this->m_fullBackupPrefix).field_2._M_local_buf[0] = '\0';
  local_a0[0] = local_90;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar1,pcVar1 + path->_M_string_length);
  this_00 = (FileLog *)(backupPath->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,this_00,
             (pointer)((long)&(this_00->super_Log)._vptr_Log + backupPath->_M_string_length));
  generatePrefix_abi_cxx11_(&local_50,this_00,s);
  init(this,(EVP_PKEY_CTX *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  return;
}

Assistant:

FileLog::FileLog( const std::string& path, const std::string& backupPath, const SessionID& s )
{
  init( path, backupPath, generatePrefix(s) );
}